

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

uint __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::linear_index
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,uint d0,
          __va_list_tag *vl)

{
  uint uVar1;
  undefined8 *puVar2;
  uint *local_50;
  uint local_28;
  uint dx;
  uint i;
  uint ret;
  __va_list_tag *vl_local;
  uint d0_local;
  sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this_local;
  
  if (this->_dims[0] <= d0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "Index out of bounds!";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  local_28 = 1;
  dx = d0;
  while( true ) {
    if (2 < local_28) {
      return dx;
    }
    uVar1 = vl->gp_offset;
    if (uVar1 < 0x29) {
      local_50 = (uint *)((long)(int)uVar1 + (long)vl->reg_save_area);
      vl->gp_offset = uVar1 + 8;
    }
    else {
      local_50 = (uint *)vl->overflow_arg_area;
      vl->overflow_arg_area = local_50 + 2;
    }
    if (this->_dims[local_28] <= *local_50) break;
    dx = *local_50 + this->_dims[local_28] * dx;
    local_28 = local_28 + 1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Index out of bounds!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

inline unsigned int linear_index(unsigned int d0, va_list vl) const {
            unsigned int ret = d0;
            if(ret >= _dims[0]) throw "Index out of bounds!";

            for(unsigned int i = 1; i < N; i++){
                unsigned int dx = va_arg(vl, unsigned int);
                if(dx >= _dims[i]) throw "Index out of bounds!";
                ret = (dx + _dims[i]*ret);
            }
            return ret;
        }